

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O0

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryManager::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryManager *this,
          VkDeviceSize Size,VkDeviceSize Alignment,uint32_t MemoryTypeIndex,bool HostVisible,
          VkMemoryAllocateFlags AllocateFlags)

{
  unsigned_long uVar1;
  undefined *puVar2;
  iterator iVar3;
  bool bVar4;
  reference pvVar5;
  reference __b_00;
  unsigned_long *puVar6;
  undefined8 uVar7;
  pointer ppVar8;
  Char *pCVar9;
  type_conflict1 tVar10;
  reference pvVar11;
  size_type __n;
  pair<std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>_>
  pVar12;
  MemorySizeFormatter<unsigned_long> *in_stack_fffffffffffffc90;
  char (*local_308) [16];
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  local_2c0;
  __atomic_base<long> local_290;
  undefined1 local_288 [8];
  string msg_1;
  string msg;
  MemorySizeFormatter<unsigned_long> local_230;
  MemorySizeFormatter<unsigned_long> local_218;
  undefined1 local_200 [8];
  string _msg;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  local_e0;
  iterator it;
  VkDeviceSize PageSize;
  size_t stat_ind;
  _Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
  local_b0;
  _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
  page_it;
  pair<std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>_>
  range;
  lock_guard<std::mutex> Lock;
  undefined1 local_7c [8];
  MemoryPageIndex PageIdx;
  bool HostVisible_local;
  uint32_t MemoryTypeIndex_local;
  VkDeviceSize Alignment_local;
  VkDeviceSize Size_local;
  VulkanMemoryManager *this_local;
  VulkanMemoryAllocation *Allocation;
  memory_order __b;
  
  PageIdx.AllocateFlags._2_1_ = 0;
  PageIdx.AllocateFlags._3_1_ = HostVisible;
  PageIdx._8_4_ = MemoryTypeIndex;
  VulkanMemoryAllocation::VulkanMemoryAllocation(__return_storage_ptr__);
  MemoryPageIndex::MemoryPageIndex
            ((MemoryPageIndex *)local_7c,PageIdx._8_4_,(bool)(PageIdx.AllocateFlags._3_1_ & 1),
             AllocateFlags);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&range.second,&this->m_PagesMtx)
  ;
  pVar12 = std::
           unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage,_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,_std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,_std::allocator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>_>_>
           ::equal_range(&this->m_Pages,(key_type *)local_7c);
  page_it = pVar12.first.
            super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
            ._M_cur;
  while( true ) {
    range.first = pVar12.second.
                  super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                  ._M_cur;
    local_b0._M_cur =
         (__node_type *)
         pVar12.first.
         super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
         ._M_cur;
    bVar4 = std::__detail::operator!=
                      (&local_b0,
                       (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                        *)&range);
    if (!bVar4) break;
    ppVar8 = std::__detail::
             _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                           *)&local_b0);
    VulkanMemoryPage::Allocate((VulkanMemoryAllocation *)&stat_ind,&ppVar8->second,Size,Alignment);
    VulkanMemoryAllocation::operator=(__return_storage_ptr__,(VulkanMemoryAllocation *)&stat_ind);
    VulkanMemoryAllocation::~VulkanMemoryAllocation((VulkanMemoryAllocation *)&stat_ind);
    if (__return_storage_ptr__->Page != (VulkanMemoryPage *)0x0) break;
    std::__detail::
    _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                  *)&local_b0);
    pVar12.second =
         (_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
          )(_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
            )range.first.
             super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
             ._M_cur;
    pVar12.first.
    super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
               )(_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                 )local_b0._M_cur;
  }
  __n = (size_type)(int)(uint)((PageIdx.AllocateFlags._3_1_ & 1) != 0);
  if (__return_storage_ptr__->Page == (VulkanMemoryPage *)0x0) {
    if ((PageIdx.AllocateFlags._3_1_ & 1) == 0) {
      local_2c0._M_cur = (__node_type *)this->m_DeviceLocalPageSize;
    }
    else {
      local_2c0._M_cur = (__node_type *)this->m_HostVisiblePageSize;
    }
    for (it.
         super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
         ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                    )(_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                      )local_2c0._M_cur;
        iVar3.
        super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
        ._M_cur = it.
                  super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                  ._M_cur,
        (ulong)it.
               super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
               ._M_cur < Size;
        it.
        super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
        ._M_cur = (_Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                   )((long)it.
                           super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                           ._M_cur << 1)) {
    }
    pvVar5 = std::array<unsigned_long,_2UL>::operator[](&this->m_CurrAllocatedSize,__n);
    *pvVar5 = *pvVar5 + (long)iVar3.
                              super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
                              ._M_cur;
    pvVar5 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,__n);
    __b_00 = std::array<unsigned_long,_2UL>::operator[](&this->m_CurrAllocatedSize,__n);
    puVar6 = std::max<unsigned_long>(pvVar5,__b_00);
    uVar1 = *puVar6;
    pvVar5 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakAllocatedSize,__n);
    *pvVar5 = uVar1;
    VulkanMemoryPage::VulkanMemoryPage
              ((VulkanMemoryPage *)((long)&_msg.field_2 + 8),this,
               (VkDeviceSize)
               it.
               super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
               ._M_cur,PageIdx._8_4_,(bool)(PageIdx.AllocateFlags._3_1_ & 1),AllocateFlags);
    local_e0._M_cur =
         (__node_type *)
         std::
         unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,VulkanUtilities::VulkanMemoryPage,VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,std::allocator<std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>>>
         ::
         emplace<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex&,VulkanUtilities::VulkanMemoryPage>
                   ((unordered_multimap<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,VulkanUtilities::VulkanMemoryPage,VulkanUtilities::VulkanMemoryManager::MemoryPageIndex::Hasher,std::equal_to<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex>,std::allocator<std::pair<VulkanUtilities::VulkanMemoryManager::MemoryPageIndex_const,VulkanUtilities::VulkanMemoryPage>>>
                     *)&this->m_Pages,(MemoryPageIndex *)local_7c,
                    (VulkanMemoryPage *)((long)&_msg.field_2 + 8));
    VulkanMemoryPage::~VulkanMemoryPage((VulkanMemoryPage *)((long)&_msg.field_2 + 8));
    if ((PageIdx.AllocateFlags._3_1_ & 1) == 0) {
      local_308 = (char (*) [16])0xe4b792;
    }
    else {
      local_308 = (char (*) [16])0xe4b785;
    }
    Diligent::FormatMemorySize<unsigned_long>
              (&local_218,
               (unsigned_long)
               it.
               super__Node_iterator_base<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_true>
               ._M_cur,2,0);
    pvVar5 = std::array<unsigned_long,_2UL>::operator[](&this->m_CurrAllocatedSize,__n);
    Diligent::FormatMemorySize<unsigned_long>(&local_230,*pvVar5,2,0);
    Diligent::
    FormatString<char[22],std::__cxx11::string,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
              ((string *)local_200,(Diligent *)"VulkanMemoryManager \'",
               (char (*) [22])&this->m_MgrName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\': created new ",local_308,(char (*) [13])" page. (",(char (*) [9])&local_218,
               (MemorySizeFormatter<unsigned_long> *)", type idx: ",
               (char (*) [13])&PageIdx.IsHostVisible,(uint *)"). Current allocated size: ",
               (char (*) [28])&local_230,in_stack_fffffffffffffc90);
    puVar2 = Diligent::DebugMessageCallback;
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      uVar7 = std::__cxx11::string::c_str();
      (*(code *)puVar2)(0,uVar7,0);
    }
    std::__cxx11::string::~string((string *)local_200);
    ppVar8 = std::__detail::
             _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                           *)&local_e0);
    (**this->_vptr_VulkanMemoryManager)(this,&ppVar8->second);
    ppVar8 = std::__detail::
             _Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_VulkanUtilities::VulkanMemoryManager::MemoryPageIndex,_VulkanUtilities::VulkanMemoryPage>,_false,_true>
                           *)&local_e0);
    VulkanMemoryPage::Allocate
              ((VulkanMemoryAllocation *)((long)&msg.field_2 + 8),&ppVar8->second,Size,Alignment);
    VulkanMemoryAllocation::operator=
              (__return_storage_ptr__,(VulkanMemoryAllocation *)((long)&msg.field_2 + 8));
    VulkanMemoryAllocation::~VulkanMemoryAllocation
              ((VulkanMemoryAllocation *)((long)&msg.field_2 + 8));
    if (__return_storage_ptr__->Page == (VulkanMemoryPage *)0x0) {
      Diligent::FormatString<char[35]>
                ((string *)((long)&msg_1.field_2 + 8),
                 (char (*) [35])"Failed to allocate new memory page");
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar9,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                 ,199);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    }
  }
  if ((__return_storage_ptr__->Page != (VulkanMemoryPage *)0x0) &&
     (tVar10 = Diligent::AlignUp<unsigned_long,unsigned_long>
                         (__return_storage_ptr__->UnalignedOffset,Alignment),
     __return_storage_ptr__->Size < (Size + tVar10) - __return_storage_ptr__->UnalignedOffset)) {
    Diligent::FormatString<char[26],char[112]>
              ((string *)local_288,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size"
               ,(char (*) [112])__return_storage_ptr__);
    pCVar9 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar9,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0xcc);
    std::__cxx11::string::~string((string *)local_288);
  }
  pvVar11 = std::array<std::atomic<long>,_2UL>::operator[](&this->m_CurrUsedSize,__n);
  LOCK();
  (pvVar11->super___atomic_base<long>)._M_i =
       (pvVar11->super___atomic_base<long>)._M_i + __return_storage_ptr__->Size;
  UNLOCK();
  pvVar5 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakUsedSize,__n);
  pvVar11 = std::array<std::atomic<long>,_2UL>::operator[](&this->m_CurrUsedSize,__n);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_290._M_i = (pvVar11->super___atomic_base<long>)._M_i;
  puVar6 = std::max<unsigned_long>(pvVar5,(unsigned_long *)&local_290);
  uVar1 = *puVar6;
  pvVar5 = std::array<unsigned_long,_2UL>::operator[](&this->m_PeakUsedSize,__n);
  *pvVar5 = uVar1;
  PageIdx.AllocateFlags._2_1_ = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&range.second);
  if ((PageIdx.AllocateFlags._2_1_ & 1) == 0) {
    VulkanMemoryAllocation::~VulkanMemoryAllocation(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanMemoryAllocation VulkanMemoryManager::Allocate(VkDeviceSize Size, VkDeviceSize Alignment, uint32_t MemoryTypeIndex, bool HostVisible, VkMemoryAllocateFlags AllocateFlags)
{
    VulkanMemoryAllocation Allocation;

    // On integrated GPUs, there is no difference between host-visible and GPU-only
    // memory, so MemoryTypeIndex is the same. As GPU-only pages do not have CPU address,
    // we need to use HostVisible flag to differentiate the two.
    // It is likely a good idea to always keep staging pages separate to reduce fragmentation
    // even though on integrated GPUs same pages can be used for both GPU-only and staging
    // allocations. Staging allocations are short-living and will be released when upload is
    // complete, while GPU-only allocations are expected to be long-living.
    MemoryPageIndex             PageIdx{MemoryTypeIndex, HostVisible, AllocateFlags};
    std::lock_guard<std::mutex> Lock{m_PagesMtx};

    auto range = m_Pages.equal_range(PageIdx);
    for (auto page_it = range.first; page_it != range.second; ++page_it)
    {
        Allocation = page_it->second.Allocate(Size, Alignment);
        if (Allocation.Page != nullptr)
            break;
    }

    size_t stat_ind = HostVisible ? 1 : 0;
    if (Allocation.Page == nullptr)
    {
        auto PageSize = HostVisible ? m_HostVisiblePageSize : m_DeviceLocalPageSize;
        while (PageSize < Size)
            PageSize *= 2;

        m_CurrAllocatedSize[stat_ind] += PageSize;
        m_PeakAllocatedSize[stat_ind] = std::max(m_PeakAllocatedSize[stat_ind], m_CurrAllocatedSize[stat_ind]);

        auto it = m_Pages.emplace(PageIdx, VulkanMemoryPage{*this, PageSize, MemoryTypeIndex, HostVisible, AllocateFlags});
        LOG_INFO_MESSAGE("VulkanMemoryManager '", m_MgrName, "': created new ", (HostVisible ? "host-visible" : "device-local"),
                         " page. (", Diligent::FormatMemorySize(PageSize, 2), ", type idx: ", MemoryTypeIndex,
                         "). Current allocated size: ", Diligent::FormatMemorySize(m_CurrAllocatedSize[stat_ind], 2));
        OnNewPageCreated(it->second);
        Allocation = it->second.Allocate(Size, Alignment);
        DEV_CHECK_ERR(Allocation.Page != nullptr, "Failed to allocate new memory page");
    }

    if (Allocation.Page != nullptr)
    {
        VERIFY_EXPR(Size + Diligent::AlignUp(Allocation.UnalignedOffset, Alignment) - Allocation.UnalignedOffset <= Allocation.Size);
    }

    m_CurrUsedSize[stat_ind].fetch_add(Allocation.Size);
    m_PeakUsedSize[stat_ind] = std::max(m_PeakUsedSize[stat_ind], static_cast<VkDeviceSize>(m_CurrUsedSize[stat_ind].load()));

    return Allocation;
}